

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderLang.cpp
# Opt level: O0

int ShInitialize(void)

{
  TPoolAllocator *this;
  lock_guard<std::mutex> local_10;
  lock_guard<std::mutex> lock;
  
  std::lock_guard<std::mutex>::lock_guard(&local_10,(mutex_type *)(anonymous_namespace)::init_lock);
  (anonymous_namespace)::NumberOfClients = (anonymous_namespace)::NumberOfClients + 1;
  if ((anonymous_namespace)::PerProcessGPA == (TPoolAllocator *)0x0) {
    this = (TPoolAllocator *)operator_new(0x60);
    glslang::TPoolAllocator::TPoolAllocator(this,0x2000,0x10);
    (anonymous_namespace)::PerProcessGPA = this;
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_10);
  return 1;
}

Assistant:

int ShInitialize()
{
#ifndef DISABLE_THREAD_SUPPORT
    const std::lock_guard<std::mutex> lock(init_lock);
#endif
    ++NumberOfClients;

    if (PerProcessGPA == nullptr)
        PerProcessGPA = new TPoolAllocator();

    return 1;
}